

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
* cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::find_word_endings
            (Iterator first,Iterator last)

{
  Char_conflict c_00;
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  char *in_RSI;
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *in_RDI;
  bool next_alphanumeric;
  bool next_uppercase;
  char c;
  Iterator it;
  bool prev_alphanumeric;
  bool prev_uppercase;
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *word_ends;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *this;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  byte local_1b;
  byte local_1a;
  undefined1 local_19;
  char *local_10;
  
  local_19 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector((vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
            *)0x1a601a);
  local_1a = 0;
  local_1b = 0;
  local_28._M_current = local_10;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)), bVar1
        ) {
    pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_28);
    c_00 = *pcVar3;
    bVar1 = SimpleStringTraits::is_uppercase(c_00);
    bVar2 = SimpleStringTraits::is_alphanumeric(c_00);
    in_stack_ffffffffffffff9f = bVar2;
    if (((local_1b & 1) != 0) && ((!bVar2 || (((local_1a & 1) == 0 && (bVar1)))))) {
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator-((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)this,
                (difference_type)in_RDI);
      std::
      vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::push_back(in_RDI,(value_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
                 );
    }
    local_1b = bVar2;
    local_1a = bVar1;
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&local_28);
  }
  if ((local_1b & 1) != 0) {
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::operator-
              ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)this,
               (difference_type)in_RDI);
    std::
    vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
    ::push_back(in_RDI,(value_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  }
  return this;
}

Assistant:

static std::vector<Iterator> find_word_endings(Iterator const first,
                                                 Iterator const last) {
    std::vector<Iterator> word_ends;
    bool prev_uppercase = false;
    bool prev_alphanumeric = false;
    for (auto it = first; it != last; ++it) {
      auto const c = *it;
      bool const next_uppercase = StringTraits::is_uppercase(c);
      bool const next_alphanumeric = StringTraits::is_alphanumeric(c);
      if (prev_alphanumeric &&
          (!next_alphanumeric || (!prev_uppercase && next_uppercase))) {
        word_ends.push_back(it - 1);
      }
      prev_uppercase = next_uppercase;
      prev_alphanumeric = next_alphanumeric;
    }
    if (prev_alphanumeric) {
      word_ends.push_back(last - 1);
    }
    return word_ends;
  }